

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::CheckerDataDeclarationSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,CheckerDataDeclarationSyntax *this,
          size_t index)

{
  Token token;
  DataDeclarationSyntax *node;
  SyntaxNode *local_50;
  size_t index_local;
  CheckerDataDeclarationSyntax *this_local;
  
  if (index == 0) {
    local_50 = (SyntaxNode *)0x0;
    if (this != (CheckerDataDeclarationSyntax *)0xfffffffffffffff0) {
      local_50 = &(this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode;
    }
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,local_50);
  }
  else if (index == 1) {
    token.kind = (this->rand).kind;
    token._2_1_ = (this->rand).field_0x2;
    token.numFlags.raw = (this->rand).numFlags.raw;
    token.rawLen = (this->rand).rawLen;
    token.info = (this->rand).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token);
  }
  else if (index == 2) {
    node = not_null<slang::syntax::DataDeclarationSyntax_*>::get(&this->data);
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(SyntaxNode *)node);
  }
  else {
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax CheckerDataDeclarationSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return &attributes;
        case 1: return rand;
        case 2: return data.get();
        default: return nullptr;
    }
}